

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O2

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestExtends::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  long lVar1;
  int iVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined6 in_register_00000032;
  DispatchCallResult DVar4;
  undefined8 uVar3;
  
  lVar1 = *(long *)CONCAT62(in_register_00000032,methodId);
  iVar2 = (int)context.hook;
  if (iVar2 == 2) {
    (**(code **)(lVar1 + 0x50))(this);
    uVar3 = extraout_RDX_01;
  }
  else if (iVar2 == 1) {
    (**(code **)(lVar1 + 0x48))(this);
    uVar3 = extraout_RDX_00;
  }
  else {
    if (iVar2 != 0) {
      DVar4 = ::capnp::Capability::Server::internalUnimplemented
                        ((Server *)this,
                         (char *)((long)CONCAT62(in_register_00000032,methodId) +
                                 *(long *)(lVar1 + -0x18)),0x2b0ef3,0xb748);
      uVar3 = DVar4._8_8_;
      goto LAB_001edede;
    }
    (**(code **)(lVar1 + 0x40))(this);
    uVar3 = extraout_RDX;
  }
  *(undefined2 *)&this->field_0x8 = 0;
LAB_001edede:
  DVar4.isStreaming = (bool)(char)uVar3;
  DVar4.allowCancellation = (bool)(char)((ulong)uVar3 >> 8);
  DVar4._10_6_ = (int6)((ulong)uVar3 >> 0x10);
  DVar4.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar4;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestExtends::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        qux(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestExtends::QuxParams,  ::capnproto_test::capnp::test::TestExtends::QuxResults>(context)),
        false,
        false
      };
    case 1:
      return {
        corge(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestAllTypes,  ::capnproto_test::capnp::test::TestExtends::CorgeResults>(context)),
        false,
        false
      };
    case 2:
      return {
        grault(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestExtends::GraultParams,  ::capnproto_test::capnp::test::TestAllTypes>(context)),
        false,
        false
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestExtends",
          0xe4e9bac98670b748ull, methodId);
  }
}